

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool __thiscall
cmComputeLinkInformation::AddLibraryFeature(cmComputeLinkInformation *this,string *feature)

{
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  cmake *pcVar2;
  iterator iVar3;
  bool bVar4;
  pointer ppVar5;
  string *psVar6;
  size_type sVar7;
  reference pvVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_bool>
  pVar9;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  LibraryFeatureDescriptor local_9b8;
  _Base_ptr local_910;
  undefined1 local_908;
  string local_900;
  string local_8e0;
  string local_8c0;
  LibraryFeatureDescriptor local_8a0;
  undefined1 local_7f8 [16];
  string local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_7c8;
  undefined1 local_7b8 [40];
  size_t sStack_790;
  size_type local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_780;
  _Base_ptr p_Stack_770;
  _Base_ptr local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_760;
  undefined1 auStack_750 [32];
  size_t sStack_730;
  size_type local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_720;
  undefined1 local_708 [16];
  string local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_6d8;
  undefined1 local_6c8 [40];
  size_t sStack_6a0;
  size_type local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_690;
  _Base_ptr p_Stack_680;
  _Base_ptr local_678;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_670;
  undefined1 auStack_660 [32];
  size_t sStack_640;
  size_type local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_630;
  undefined1 local_618 [16];
  string local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_5e8;
  undefined1 local_5d8 [40];
  size_t sStack_5b0;
  size_type local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_5a0;
  _Base_ptr p_Stack_590;
  _Base_ptr local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_580;
  __node_base _Stack_570;
  _Base_ptr local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_560;
  __node_base_ptr p_Stack_550;
  size_type local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_540;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_488;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_480;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_478;
  undefined1 local_470 [16];
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c8 [16];
  string local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_398;
  _Base_ptr local_388;
  _Base_ptr p_Stack_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_378;
  _Base_ptr local_368;
  _Base_ptr p_Stack_360;
  _Base_ptr local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_350;
  _Base_ptr p_Stack_340;
  _Base_ptr local_338;
  undefined1 auStack_330 [24];
  _Base_ptr local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_310;
  _Base_ptr p_Stack_300;
  _Base_ptr local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_2f0;
  undefined1 local_2e0 [24];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  string local_2a8;
  pointer local_288;
  undefined1 local_280;
  pointer local_278;
  _Base_ptr p_Stack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_268;
  _Base_ptr local_258;
  _Base_ptr p_Stack_250;
  _Base_ptr local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_240;
  _Base_ptr p_Stack_230;
  _Base_ptr local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_220;
  _Base_ptr p_Stack_210;
  _Base_ptr local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_200;
  _Base_ptr p_Stack_1f0;
  _Base_ptr local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_1e0;
  cmValue local_1c8;
  cmValue langFeature;
  undefined1 local_1b8 [16];
  string local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_188;
  _Base_ptr local_178;
  __node_base _Stack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_168;
  _Base_ptr local_158;
  _Base_ptr p_Stack_150;
  _Base_ptr local_148;
  undefined1 auStack_140 [24];
  _Base_ptr local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_120;
  _Base_ptr p_Stack_110;
  _Base_ptr local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_100;
  _Base_ptr p_Stack_f0;
  _Base_ptr local_e8;
  undefined1 auStack_e0 [16];
  string local_d0;
  _Base_ptr local_b0;
  string local_a8;
  string local_78;
  cmValue local_58;
  cmValue featureSupported;
  string featureName;
  _Self local_28;
  iterator it;
  string *feature_local;
  cmComputeLinkInformation *this_local;
  
  it._M_node = (_Base_ptr)feature;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
       ::find(&this->LibraryFeatureDescriptors,feature);
  featureName.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
       ::end(&this->LibraryFeatureDescriptors);
  bVar4 = std::operator!=(&local_28,(_Self *)((long)&featureName.field_2 + 8));
  if (bVar4) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
             ::operator->(&local_28);
    return (bool)((ppVar5->second).Supported & 1);
  }
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[21],std::__cxx11::string_const&>
            ((string *)&featureSupported,(char (*) [7])0x104930a,&this->LinkLanguage,
             (char (*) [21])0x1077f74,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node);
  pcVar1 = this->Makefile;
  cmStrCat<std::__cxx11::string&,char_const(&)[11]>
            (&local_78,(string *)&featureSupported,(char (*) [11])0x108fe09);
  local_58 = cmMakefile::GetDefinition(pcVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar4 = cmValue::operator_cast_to_bool(&local_58);
  if (!bVar4) {
    cmStrCat<char_const(&)[26],std::__cxx11::string_const&>
              (&local_a8,(char (*) [26])"CMAKE_LINK_LIBRARY_USING_",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node);
    std::__cxx11::string::operator=((string *)&featureSupported,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    pcVar1 = this->Makefile;
    cmStrCat<std::__cxx11::string&,char_const(&)[11]>
              (&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &featureSupported,(char (*) [11])0x108fe09);
    local_b0 = (_Base_ptr)cmMakefile::GetDefinition(pcVar1,&local_d0);
    local_58 = (cmValue)local_b0;
    std::__cxx11::string::~string((string *)&local_d0);
  }
  bVar4 = cmValue::IsOn(&local_58);
  iVar3 = it;
  if (!bVar4) {
    local_e8 = (_Base_ptr)0x0;
    auStack_e0._0_8_ = 0;
    aStack_100._8_8_ = 0;
    p_Stack_f0 = (_Base_ptr)0x0;
    local_108 = (_Base_ptr)0x0;
    aStack_100._M_allocated_capacity = 0;
    aStack_120._8_8_ = 0;
    p_Stack_110 = (_Base_ptr)0x0;
    local_128 = (_Base_ptr)0x0;
    aStack_120._M_allocated_capacity = 0;
    auStack_140._8_8_ = 0;
    auStack_140._16_8_ = (_Base_ptr)0x0;
    local_148 = (_Base_ptr)0x0;
    auStack_140._0_8_ = 0;
    local_158 = (_Base_ptr)0x0;
    p_Stack_150 = (_Base_ptr)0x0;
    local_168._M_allocated_capacity = 0;
    local_168._8_8_ = 0;
    local_178 = (_Base_ptr)0x0;
    _Stack_170._M_nxt = (_Hash_node_base *)0x0;
    auStack_e0._8_8_ = 0;
    FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)&local_178);
    pVar9 = std::
            map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
            ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                      ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                        *)&this->LibraryFeatureDescriptors,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       iVar3._M_node,(FeatureDescriptor *)&local_178);
    local_188._M_allocated_capacity = (size_type)pVar9.first._M_node;
    local_188._M_local_buf[8] = pVar9.second;
    FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)&local_178);
    iVar3 = it;
    pcVar2 = this->CMakeInstance;
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[77],std::__cxx11::string_const&,char_const(&)[30],std::__cxx11::string&,char_const(&)[17]>
              ((string *)(local_1b8 + 0x10),(char (*) [10])"Feature \'",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3._M_node,
               (char (*) [77])
               "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'",
               psVar6,(char (*) [30])"\', is not supported for the \'",&this->LinkLanguage,
               (char (*) [17])"\' link language.");
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1b8);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_1b8 + 0x10),
                        (cmListFileBacktrace *)local_1b8);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1b8);
    std::__cxx11::string::~string((string *)(local_1b8 + 0x10));
    this_local._7_1_ = false;
    langFeature.Value._4_4_ = 1;
    goto LAB_007bf144;
  }
  local_1c8 = cmMakefile::GetDefinition(this->Makefile,(string *)&featureSupported);
  bVar4 = cmValue::operator_cast_to_bool(&local_1c8);
  iVar3 = it;
  if (!bVar4) {
    local_1e8 = (_Base_ptr)0x0;
    aStack_1e0._M_allocated_capacity = 0;
    aStack_200._8_8_ = 0;
    p_Stack_1f0 = (_Base_ptr)0x0;
    local_208 = (_Base_ptr)0x0;
    aStack_200._M_allocated_capacity = 0;
    aStack_220._8_8_ = 0;
    p_Stack_210 = (_Base_ptr)0x0;
    local_228 = (_Base_ptr)0x0;
    aStack_220._M_allocated_capacity = 0;
    aStack_240._8_8_ = 0;
    p_Stack_230 = (_Base_ptr)0x0;
    local_248 = (_Base_ptr)0x0;
    aStack_240._M_allocated_capacity = 0;
    local_258 = (_Base_ptr)0x0;
    p_Stack_250 = (_Base_ptr)0x0;
    local_268._M_allocated_capacity = 0;
    local_268._8_8_ = 0;
    local_278 = (pointer)0x0;
    p_Stack_270 = (_Base_ptr)0x0;
    aStack_1e0._8_8_ = 0;
    FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)&local_278);
    pVar9 = std::
            map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
            ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                      ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                        *)&this->LibraryFeatureDescriptors,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       iVar3._M_node,(FeatureDescriptor *)&local_278);
    local_288 = (pointer)pVar9.first._M_node;
    local_280 = pVar9.second;
    FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)&local_278);
    iVar3 = it;
    pcVar2 = this->CMakeInstance;
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[77],std::__cxx11::string_const&,char_const(&)[28],std::__cxx11::string&,char_const(&)[17]>
              (&local_2a8,(char (*) [10])"Feature \'",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3._M_node,
               (char (*) [77])
               "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'",
               psVar6,(char (*) [28])"\', is not defined for the \'",&this->LinkLanguage,
               (char (*) [17])"\' link language.");
    cmGeneratorTarget::GetBacktrace
              ((cmGeneratorTarget *)
               &items.
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_2a8,
                        (cmListFileBacktrace *)
                        &items.
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)
               &items.
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_2a8);
    this_local._7_1_ = false;
    langFeature.Value._4_4_ = 1;
    goto LAB_007bf144;
  }
  psVar6 = cmValue::operator*[abi_cxx11_(&local_1c8);
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_2e0);
  cmExpandListWithBacktrace
            ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_2e0 + 0x10),psVar6,(cmListFileBacktrace *)local_2e0,Yes);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2e0);
  sVar7 = std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_2e0 + 0x10));
  if (sVar7 == 1) {
    pvVar8 = std::
             vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::front((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_2e0 + 0x10));
    bVar4 = anon_unknown.dwarf_fea82c::IsValidFeatureFormat(&pvVar8->Value);
    if (bVar4) goto LAB_007bde23;
LAB_007bde6a:
    iVar3._M_node = it._M_node;
    local_2f8 = (_Base_ptr)0x0;
    aStack_2f0._M_allocated_capacity = 0;
    aStack_310._8_8_ = 0;
    p_Stack_300 = (_Base_ptr)0x0;
    local_318 = (_Base_ptr)0x0;
    aStack_310._M_allocated_capacity = 0;
    auStack_330._8_8_ = 0;
    auStack_330._16_8_ = 0;
    local_338 = (_Base_ptr)0x0;
    auStack_330._0_8_ = 0;
    aStack_350._8_8_ = 0;
    p_Stack_340 = (_Base_ptr)0x0;
    local_358 = (_Base_ptr)0x0;
    aStack_350._M_allocated_capacity = 0;
    local_368 = (_Base_ptr)0x0;
    p_Stack_360 = (_Base_ptr)0x0;
    local_378._M_allocated_capacity = 0;
    local_378._8_8_ = 0;
    local_388 = (_Base_ptr)0x0;
    p_Stack_380 = (_Base_ptr)0x0;
    aStack_2f0._8_8_ = 0;
    FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)&local_388);
    pVar9 = std::
            map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
            ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                      ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                        *)&this->LibraryFeatureDescriptors,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       iVar3._M_node,(FeatureDescriptor *)&local_388);
    local_398._M_allocated_capacity = (size_type)pVar9.first._M_node;
    local_398._M_local_buf[8] = pVar9.second;
    FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)&local_388);
    iVar3 = it;
    pcVar2 = this->CMakeInstance;
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string&,char_const(&)[119],std::__cxx11::string_const&,char_const(&)[3]>
              ((string *)(local_3c8 + 0x10),(char (*) [10])"Feature \'",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3._M_node,
               (char (*) [27])"\', specified by variable \'",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &featureSupported,
               (char (*) [119])
               "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing) and cannot be used to link target \'"
               ,psVar6,(char (*) [3])0x104eb7e);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_3c8);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_3c8 + 0x10),
                        (cmListFileBacktrace *)local_3c8);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_3c8);
    std::__cxx11::string::~string((string *)(local_3c8 + 0x10));
    this_local._7_1_ = false;
  }
  else {
LAB_007bde23:
    sVar7 = std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_2e0 + 0x10));
    if (sVar7 == 3) {
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_2e0 + 0x10),1);
      bVar4 = anon_unknown.dwarf_fea82c::IsValidFeatureFormat(&pvVar8->Value);
      if (!bVar4) goto LAB_007bde6a;
    }
    sVar7 = std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_2e0 + 0x10));
    if (sVar7 == 1) {
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::front((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_2e0 + 0x10));
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_2e0 + 0x10),pvVar8);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_2e0 + 0x10),0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"PATH{",&local_3e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"NAME{",&local_411);
      anon_unknown.dwarf_fea82c::FinalizeFeatureFormat(&pvVar8->Value,&local_3e8,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator(&local_411);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_2e0 + 0x10),1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"NAME{",&local_439);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,"PATH{",(allocator<char> *)(local_470 + 0xf));
      anon_unknown.dwarf_fea82c::FinalizeFeatureFormat(&pvVar8->Value,&local_438,&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator((allocator<char> *)(local_470 + 0xf));
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator(&local_439);
    }
    else {
      sVar7 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_2e0 + 0x10));
      iVar3 = it;
      if (sVar7 != 3) {
        local_548 = 0;
        aStack_540._M_allocated_capacity = 0;
        aStack_560._8_8_ = 0;
        p_Stack_550 = (__node_base_ptr)0x0;
        local_568 = (_Base_ptr)0x0;
        aStack_560._M_allocated_capacity = 0;
        aStack_580._8_8_ = 0;
        _Stack_570._M_nxt = (_Hash_node_base *)0x0;
        local_588 = (_Base_ptr)0x0;
        aStack_580._M_allocated_capacity = 0;
        aStack_5a0._8_8_ = 0;
        p_Stack_590 = (_Base_ptr)0x0;
        local_5a8 = 0;
        aStack_5a0._M_allocated_capacity = 0;
        local_5d8._32_8_ = (_Base_ptr)0x0;
        sStack_5b0 = 0;
        local_5d8._16_8_ = 0;
        local_5d8._24_8_ = 0;
        local_5d8._0_8_ = 0;
        local_5d8._8_8_ = (_Base_ptr)0x0;
        aStack_540._8_8_ = 0;
        FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)local_5d8);
        pVar9 = std::
                map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                          ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                            *)&this->LibraryFeatureDescriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           iVar3._M_node,(FeatureDescriptor *)local_5d8);
        local_5e8._M_allocated_capacity = (size_type)pVar9.first._M_node;
        local_5e8._M_local_buf[8] = pVar9.second;
        FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_5d8);
        iVar3 = it;
        pcVar2 = this->CMakeInstance;
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string&,char_const(&)[79],std::__cxx11::string_const&,char_const(&)[3]>
                  ((string *)(local_618 + 0x10),(char (*) [10])"Feature \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   iVar3._M_node,(char (*) [27])"\', specified by variable \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &featureSupported,
                   (char (*) [79])
                   "\', is malformed (wrong number of elements) and cannot be used to link target \'"
                   ,psVar6,(char (*) [3])0x104eb7e);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_618);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_618 + 0x10),
                            (cmListFileBacktrace *)local_618);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_618);
        std::__cxx11::string::~string((string *)(local_618 + 0x10));
        this_local._7_1_ = false;
        goto LAB_007bf128;
      }
      this_00 = (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_2e0 + 0x10);
      local_480._M_current =
           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(this_00);
      local_478 = __gnu_cxx::
                  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator+(&local_480,1);
      __gnu_cxx::
      __normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
      ::__normal_iterator<BT<std::__cxx11::string>*>
                ((__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  *)local_470,&local_478);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,1);
      local_488 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)std::
                     vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::insert(this_00,(const_iterator)local_470._0_8_,pvVar8);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_2e0 + 0x10),1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"PATH{",&local_4a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"NAME{",&local_4d1);
      anon_unknown.dwarf_fea82c::FinalizeFeatureFormat(&pvVar8->Value,&local_4a8,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::allocator<char>::~allocator(&local_4d1);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator(&local_4a9);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_2e0 + 0x10),2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"NAME{",&local_4f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"PATH{",&local_521);
      anon_unknown.dwarf_fea82c::FinalizeFeatureFormat(&pvVar8->Value,&local_4f8,&local_520);
      std::__cxx11::string::~string((string *)&local_520);
      std::allocator<char>::~allocator(&local_521);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
    }
    sVar7 = std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_2e0 + 0x10));
    if (sVar7 == 2) {
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_2e0 + 0x10),0);
      bVar4 = anon_unknown.dwarf_fea82c::IsValidFeatureFormat(&pvVar8->Value);
      if (bVar4) goto LAB_007be85f;
LAB_007be8a6:
      iVar3._M_node = it._M_node;
      local_638 = 0;
      aStack_630._M_allocated_capacity = 0;
      auStack_660._24_8_ = 0;
      sStack_640 = 0;
      auStack_660._8_8_ = (_Base_ptr)0x0;
      auStack_660._16_8_ = 0;
      aStack_670._8_8_ = 0;
      auStack_660._0_8_ = 0;
      local_678 = (_Base_ptr)0x0;
      aStack_670._M_allocated_capacity = 0;
      aStack_690._8_8_ = 0;
      p_Stack_680 = (_Base_ptr)0x0;
      local_698 = 0;
      aStack_690._M_allocated_capacity = 0;
      local_6c8._32_8_ = (_Base_ptr)0x0;
      sStack_6a0 = 0;
      local_6c8._16_8_ = 0;
      local_6c8._24_8_ = 0;
      local_6c8._0_8_ = 0;
      local_6c8._8_8_ = 0;
      aStack_630._8_8_ = 0;
      FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)local_6c8);
      pVar9 = std::
              map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
              ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                        ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                          *)&this->LibraryFeatureDescriptors,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         iVar3._M_node,(FeatureDescriptor *)local_6c8);
      local_6d8._M_allocated_capacity = (size_type)pVar9.first._M_node;
      local_6d8._M_local_buf[8] = pVar9.second;
      FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_6c8);
      iVar3 = it;
      pcVar2 = this->CMakeInstance;
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string&,char_const(&)[144],std::__cxx11::string_const&,char_const(&)[3]>
                ((string *)(local_708 + 0x10),(char (*) [10])"Feature \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3._M_node,
                 (char (*) [27])"\', specified by variable \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &featureSupported,
                 (char (*) [144])
                 "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"PATH{}\" alternative) and cannot be used to link target \'"
                 ,psVar6,(char (*) [3])0x104eb7e);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_708);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_708 + 0x10),
                          (cmListFileBacktrace *)local_708);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_708);
      std::__cxx11::string::~string((string *)(local_708 + 0x10));
      this_local._7_1_ = false;
    }
    else {
LAB_007be85f:
      sVar7 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_2e0 + 0x10));
      if (sVar7 == 4) {
        pvVar8 = std::
                 vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(local_2e0 + 0x10),1);
        bVar4 = anon_unknown.dwarf_fea82c::IsValidFeatureFormat(&pvVar8->Value);
        if (!bVar4) goto LAB_007be8a6;
      }
      sVar7 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_2e0 + 0x10));
      if (sVar7 == 2) {
        pvVar8 = std::
                 vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(local_2e0 + 0x10),1);
        bVar4 = anon_unknown.dwarf_fea82c::IsValidFeatureFormat(&pvVar8->Value);
        if (bVar4) goto LAB_007beaf8;
LAB_007beb3f:
        iVar3._M_node = it._M_node;
        local_728 = 0;
        aStack_720._M_allocated_capacity = 0;
        auStack_750._24_8_ = 0;
        sStack_730 = 0;
        auStack_750._8_8_ = (_Base_ptr)0x0;
        auStack_750._16_8_ = 0;
        aStack_760._8_8_ = 0;
        auStack_750._0_8_ = 0;
        local_768 = (_Base_ptr)0x0;
        aStack_760._M_allocated_capacity = 0;
        aStack_780._8_8_ = 0;
        p_Stack_770 = (_Base_ptr)0x0;
        local_788 = 0;
        aStack_780._M_allocated_capacity = 0;
        local_7b8._32_8_ = (_Base_ptr)0x0;
        sStack_790 = 0;
        local_7b8._16_8_ = 0;
        local_7b8._24_8_ = 0;
        local_7b8._0_8_ = 0;
        local_7b8._8_8_ = 0;
        aStack_720._8_8_ = 0;
        FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)local_7b8);
        pVar9 = std::
                map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                          ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                            *)&this->LibraryFeatureDescriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           iVar3._M_node,(FeatureDescriptor *)local_7b8);
        local_7c8._M_allocated_capacity = (size_type)pVar9.first._M_node;
        local_7c8._M_local_buf[8] = pVar9.second;
        FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_7b8);
        iVar3 = it;
        pcVar2 = this->CMakeInstance;
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string&,char_const(&)[144],std::__cxx11::string_const&,char_const(&)[3]>
                  ((string *)(local_7f8 + 0x10),(char (*) [10])"Feature \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   iVar3._M_node,(char (*) [27])"\', specified by variable \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &featureSupported,
                   (char (*) [144])
                   "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"NAME{}\" alternative) and cannot be used to link target \'"
                   ,psVar6,(char (*) [3])0x104eb7e);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_7f8);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_7f8 + 0x10),
                            (cmListFileBacktrace *)local_7f8);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_7f8);
        std::__cxx11::string::~string((string *)(local_7f8 + 0x10));
        this_local._7_1_ = false;
      }
      else {
LAB_007beaf8:
        sVar7 = std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_2e0 + 0x10));
        if (sVar7 == 4) {
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_2e0 + 0x10),2);
          bVar4 = anon_unknown.dwarf_fea82c::IsValidFeatureFormat(&pvVar8->Value);
          if (!bVar4) goto LAB_007beb3f;
        }
        cmGeneratorTarget::ResolveLinkerWrapper
                  (this->Target,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_2e0 + 0x10),&this->LinkLanguage,true);
        sVar7 = std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_2e0 + 0x10));
        iVar3 = it;
        if (sVar7 == 2) {
          std::__cxx11::string::string((string *)&local_8c0,(string *)it._M_node);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_2e0 + 0x10),0);
          std::__cxx11::string::string((string *)&local_8e0,(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_2e0 + 0x10),1);
          std::__cxx11::string::string((string *)&local_900,(string *)pvVar8);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    (&local_8a0,&local_8c0,&local_8e0,&local_900);
          pVar9 = std::
                  map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                  ::
                  emplace<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                            ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                              *)&this->LibraryFeatureDescriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             iVar3._M_node,&local_8a0);
          local_910 = (_Base_ptr)pVar9.first._M_node;
          local_908 = pVar9.second;
          LibraryFeatureDescriptor::~LibraryFeatureDescriptor(&local_8a0);
          std::__cxx11::string::~string((string *)&local_900);
          std::__cxx11::string::~string((string *)&local_8e0);
          std::__cxx11::string::~string((string *)&local_8c0);
        }
        else {
          std::__cxx11::string::string((string *)&local_9d8,(string *)it._M_node);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_2e0 + 0x10),0);
          std::__cxx11::string::string((string *)&local_9f8,(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_2e0 + 0x10),1);
          std::__cxx11::string::string((string *)&local_a18,(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_2e0 + 0x10),2);
          std::__cxx11::string::string((string *)&local_a38,(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_2e0 + 0x10),3);
          std::__cxx11::string::string((string *)&local_a58,(string *)pvVar8);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    (&local_9b8,&local_9d8,&local_9f8,&local_a18,&local_a38,&local_a58);
          std::
          map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)&this->LibraryFeatureDescriptors,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     iVar3._M_node,&local_9b8);
          LibraryFeatureDescriptor::~LibraryFeatureDescriptor(&local_9b8);
          std::__cxx11::string::~string((string *)&local_a58);
          std::__cxx11::string::~string((string *)&local_a38);
          std::__cxx11::string::~string((string *)&local_a18);
          std::__cxx11::string::~string((string *)&local_9f8);
          std::__cxx11::string::~string((string *)&local_9d8);
        }
        this_local._7_1_ = true;
      }
    }
  }
LAB_007bf128:
  langFeature.Value._4_4_ = 1;
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_2e0 + 0x10));
LAB_007bf144:
  std::__cxx11::string::~string((string *)&featureSupported);
  return this_local._7_1_;
}

Assistant:

bool cmComputeLinkInformation::AddLibraryFeature(std::string const& feature)
{
  auto it = this->LibraryFeatureDescriptors.find(feature);
  if (it != this->LibraryFeatureDescriptors.end()) {
    return it->second.Supported;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_LIBRARY_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_LIBRARY_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not supported for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not defined for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  auto items = cmExpandListWithBacktrace(
    *langFeature, this->Target->GetBacktrace(), cmList::EmptyElements::Yes);

  if ((items.size() == 1 && !IsValidFeatureFormat(items.front().Value)) ||
      (items.size() == 3 && !IsValidFeatureFormat(items[1].Value))) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing) and cannot be used to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // now, handle possible "PATH{}" and "NAME{}" patterns
  if (items.size() == 1) {
    items.push_back(items.front());
    FinalizeFeatureFormat(items[0].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[1].Value, "NAME{", "PATH{");
  } else if (items.size() == 3) {
    items.insert(items.begin() + 1, items[1]);
    FinalizeFeatureFormat(items[1].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[2].Value, "NAME{", "PATH{");
  } else {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (wrong number of elements) and cannot be used "
               "to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[0].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[1].Value))) {
    // PATH{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"PATH{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[1].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[2].Value))) {
    // NAME{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"NAME{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value });
  } else {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value,
                                items[2].Value, items[3].Value });
  }

  return true;
}